

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkCollapseSat(Abc_Ntk_t *pNtk,int nCubeLim,int nBTLimit,int nCostMax,int fCanon,int fReverse,
                  int fCnfShared,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtkNew;
  int fReverse_local;
  int fCanon_local;
  int nCostMax_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x3b2,
                  "Abc_Ntk_t *Abc_NtkCollapseSat(Abc_Ntk_t *, int, int, int, int, int, int, int)");
  }
  pNtk_local = Abc_NtkFromSopsInt(pNtk,nCubeLim,nBTLimit,nCostMax,fCanon,fReverse,fCnfShared,
                                  fVerbose);
  if (pNtk_local == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar2 = Abc_NtkDup(pNtk->pExdc);
      pNtk_local->pExdc = pAVar2;
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkCollapseSat: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkCollapseSat( Abc_Ntk_t * pNtk, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsStrash(pNtk) );
    pNtkNew = Abc_NtkFromSopsInt( pNtk, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    if ( pNtkNew == NULL )
        return NULL;
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapseSat: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}